

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseCharClass(State *state,char *char_class)

{
  char *local_28;
  char *p;
  char *char_class_local;
  State *state_local;
  
  local_28 = char_class;
  while( true ) {
    if (*local_28 == '\0') {
      return false;
    }
    if (*state->mangled_cur == *local_28) break;
    local_28 = local_28 + 1;
  }
  state->mangled_cur = state->mangled_cur + 1;
  return true;
}

Assistant:

static bool ParseCharClass(State *state, const char *char_class) {
  const char *p = char_class;
  for (; *p != '\0'; ++p) {
    if (state->mangled_cur[0] == *p) {
      ++state->mangled_cur;
      return true;
    }
  }
  return false;
}